

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O1

bool __thiscall
ruckig::TargetCalculator<3UL,_MinimalVector>::is_input_collinear
          (TargetCalculator<3UL,_MinimalVector> *this,InputParameter<3UL,_MinimalVector> *inp,
          Direction limiting_direction,size_t limiting_dof)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ulong uVar9;
  ulong uVar10;
  Vector<double> *pVVar11;
  ulong uVar12;
  StandardVector<double,_3UL> *pSVar13;
  bool bVar14;
  double dVar15;
  
  uVar9 = this->degrees_of_freedom;
  if (uVar9 != 0) {
    uVar10 = 0;
    do {
      (this->pd).data[uVar10] =
           (inp->target_position).data[uVar10] - (inp->current_position).data[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  bVar14 = uVar9 != 0;
  if (uVar9 == 0) {
    uVar10 = 0;
  }
  else {
    uVar12 = 0;
    do {
      if (((this->inp_per_dof_synchronization)._M_elems[uVar12] == Phase) &&
         (((((this->inp_per_dof_control_interface)._M_elems[uVar12] == Position &&
            (pVVar11 = &this->pd, 2.220446049250313e-16 < ABS((this->pd).data[uVar12]))) ||
           (pVVar11 = &inp->current_velocity,
           2.220446049250313e-16 < ABS((inp->current_velocity).data[uVar12]))) ||
          (((pVVar11 = &inp->current_acceleration,
            2.220446049250313e-16 < ABS((inp->current_acceleration).data[uVar12]) ||
            (pVVar11 = &inp->target_velocity,
            2.220446049250313e-16 < ABS((inp->target_velocity).data[uVar12]))) ||
           (pVVar11 = &inp->target_acceleration,
           2.220446049250313e-16 < ABS((inp->target_acceleration).data[uVar12])))))))
      goto LAB_0016ee29;
      uVar12 = uVar12 + 1;
      bVar14 = uVar12 < uVar9;
      uVar10 = uVar9;
    } while (uVar12 != uVar9);
  }
  pVVar11 = (Vector<double> *)0x0;
  uVar12 = uVar10;
LAB_0016ee29:
  if (bVar14) {
    dVar1 = (inp->max_jerk).data[limiting_dof];
    dVar15 = dVar1;
    if (limiting_direction != UP) {
      dVar15 = (double)((ulong)dVar1 ^ (ulong)DAT_0018d870);
    }
    if (ABS(dVar1) == INFINITY) {
      pSVar13 = &this->inp_min_acceleration;
      if (limiting_direction == UP) {
        pSVar13 = (StandardVector<double,_3UL> *)&inp->max_acceleration;
      }
      dVar15 = pSVar13->_M_elems[limiting_dof];
    }
    bVar14 = uVar9 == 0;
    if (!bVar14) {
      dVar1 = pVVar11->data[uVar12];
      dVar2 = (this->pd).data[uVar12];
      dVar3 = (inp->current_velocity).data[uVar12];
      dVar4 = (inp->current_acceleration).data[uVar12];
      dVar5 = (inp->target_velocity).data[uVar12];
      dVar6 = (inp->target_acceleration).data[uVar12];
      dVar7 = pVVar11->data[limiting_dof];
      uVar10 = 0;
      do {
        if ((this->inp_per_dof_synchronization)._M_elems[uVar10] == Phase) {
          dVar8 = pVVar11->data[uVar10];
          if ((((this->inp_per_dof_control_interface)._M_elems[uVar10] == Position) &&
              (2.220446049250313e-16 < ABS((-dVar2 / dVar1) * dVar8 + (this->pd).data[uVar10]))) ||
             ((2.220446049250313e-16 <
               ABS((-dVar3 / dVar1) * dVar8 + (inp->current_velocity).data[uVar10]) ||
              (((2.220446049250313e-16 <
                 ABS((-dVar4 / dVar1) * dVar8 + (inp->current_acceleration).data[uVar10]) ||
                (2.220446049250313e-16 <
                 ABS((-dVar5 / dVar1) * dVar8 + (inp->target_velocity).data[uVar10]))) ||
               (2.220446049250313e-16 <
                ABS((-dVar6 / dVar1) * dVar8 + (inp->target_acceleration).data[uVar10])))))))
          goto LAB_0016efd6;
          (this->new_phase_control).data[uVar10] = (dVar8 * dVar15) / dVar7;
        }
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      bVar14 = true;
    }
  }
  else {
LAB_0016efd6:
    bVar14 = false;
  }
  return bVar14;
}

Assistant:

bool is_input_collinear(const InputParameter<DOFs, CustomVector>& inp, Profile::Direction limiting_direction, size_t limiting_dof) {
        // Check that vectors pd, v0, a0, vf, af are collinear
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            pd[dof] = inp.target_position[dof] - inp.current_position[dof];
        }

        const Vector<double>* scale_vector = nullptr;
        std::optional<size_t> scale_dof; // Need to find a scale DOF because limiting DOF might not be phase synchronized
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            if (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof]) > eps) {
                scale_vector = &pd;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_velocity[dof]) > eps) {
                scale_vector = &inp.current_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.current_acceleration[dof]) > eps) {
                scale_vector = &inp.current_acceleration;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_velocity[dof]) > eps) {
                scale_vector = &inp.target_velocity;
                scale_dof = dof;
                break;

            } else if (std::abs(inp.target_acceleration[dof]) > eps) {
                scale_vector = &inp.target_acceleration;
                scale_dof = dof;
                break;
            }
        }

        if (!scale_dof) {
            return false; // Zero everywhere is in theory collinear, but that trivial case is better handled elsewhere
        }

        const double scale = scale_vector->operator[](*scale_dof);
        const double pd_scale = pd[*scale_dof] / scale;
        const double v0_scale = inp.current_velocity[*scale_dof] / scale;
        const double vf_scale = inp.target_velocity[*scale_dof] / scale;
        const double a0_scale = inp.current_acceleration[*scale_dof] / scale;
        const double af_scale = inp.target_acceleration[*scale_dof] / scale;

        const double scale_limiting = scale_vector->operator[](limiting_dof);
        double control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_jerk[limiting_dof] : -inp.max_jerk[limiting_dof];
        if (std::isinf(inp.max_jerk[limiting_dof])) {
            control_limiting = (limiting_direction == Profile::Direction::UP) ? inp.max_acceleration[limiting_dof] : inp_min_acceleration[limiting_dof];
        }

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                continue;
            }

            const double current_scale = scale_vector->operator[](dof);
            if (
                (inp_per_dof_control_interface[dof] == ControlInterface::Position && std::abs(pd[dof] - pd_scale * current_scale) > eps)
                || std::abs(inp.current_velocity[dof] - v0_scale * current_scale) > eps
                || std::abs(inp.current_acceleration[dof] - a0_scale * current_scale) > eps
                || std::abs(inp.target_velocity[dof] - vf_scale * current_scale) > eps
                || std::abs(inp.target_acceleration[dof] - af_scale * current_scale) > eps
            ) {
                return false;
            }

            new_phase_control[dof] = control_limiting * current_scale / scale_limiting;
        }

        return true;
    }